

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wav_header.cc
# Opt level: O2

void webrtc::WriteWavHeader
               (uint8_t *buf,size_t num_channels,int sample_rate,WavFormat format,
               size_t bytes_per_sample,size_t num_samples)

{
  bool bVar1;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  FatalMessage FStack_1a8;
  
  bVar1 = CheckWavParameters(num_channels,sample_rate,format,bytes_per_sample,num_samples);
  if (bVar1) {
    iVar4 = (int)bytes_per_sample;
    iVar3 = (int)num_samples * iVar4;
    buf[0] = 'R';
    buf[1] = 'I';
    buf[2] = 'F';
    buf[3] = 'F';
    *(int *)(buf + 4) = iVar3 + 0x24;
    buf[8] = 'W';
    buf[9] = 'A';
    buf[10] = 'V';
    buf[0xb] = 'E';
    buf[0xc] = 'f';
    buf[0xd] = 'm';
    buf[0xe] = 't';
    buf[0xf] = ' ';
    buf[0x10] = '\x10';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    *(short *)(buf + 0x14) = (short)format;
    *(short *)(buf + 0x16) = (short)num_channels;
    *(int *)(buf + 0x18) = sample_rate;
    *(int *)(buf + 0x1c) = sample_rate * (int)num_channels * iVar4;
    *(short *)(buf + 0x20) = (short)num_channels * (short)bytes_per_sample;
    *(short *)(buf + 0x22) = (short)(iVar4 << 3);
    buf[0x24] = 'd';
    buf[0x25] = 'a';
    buf[0x26] = 't';
    buf[0x27] = 'a';
    *(int *)(buf + 0x28) = iVar3;
    return;
  }
  rtc::FatalMessage::FatalMessage
            (&FStack_1a8,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_header.cc"
             ,0x9b);
  poVar2 = std::operator<<((ostream *)&FStack_1a8,
                           "Check failed: CheckWavParameters(num_channels, sample_rate, format, bytes_per_sample, num_samples)"
                          );
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<(poVar2,"# ");
  rtc::FatalMessage::~FatalMessage(&FStack_1a8);
}

Assistant:

void WriteWavHeader(uint8_t* buf,
                    size_t num_channels,
                    int sample_rate,
                    WavFormat format,
                    size_t bytes_per_sample,
                    size_t num_samples) {
  RTC_CHECK(CheckWavParameters(num_channels, sample_rate, format,
                               bytes_per_sample, num_samples));

  WavHeader header;
  const size_t bytes_in_payload = bytes_per_sample * num_samples;

  WriteFourCC(&header.riff.header.ID, 'R', 'I', 'F', 'F');
  WriteLE32(&header.riff.header.Size, RiffChunkSize(bytes_in_payload));
  WriteFourCC(&header.riff.Format, 'W', 'A', 'V', 'E');

  WriteFourCC(&header.fmt.header.ID, 'f', 'm', 't', ' ');
  WriteLE32(&header.fmt.header.Size, kFmtSubchunkSize);
  WriteLE16(&header.fmt.AudioFormat, format);
  WriteLE16(&header.fmt.NumChannels, static_cast<uint16_t>(num_channels));
  WriteLE32(&header.fmt.SampleRate, sample_rate);
  WriteLE32(&header.fmt.ByteRate, ByteRate(num_channels, sample_rate,
                                           bytes_per_sample));
  WriteLE16(&header.fmt.BlockAlign, BlockAlign(num_channels, bytes_per_sample));
  WriteLE16(&header.fmt.BitsPerSample,
            static_cast<uint16_t>(8 * bytes_per_sample));

  WriteFourCC(&header.data.header.ID, 'd', 'a', 't', 'a');
  WriteLE32(&header.data.header.Size, static_cast<uint32_t>(bytes_in_payload));

  // Do an extra copy rather than writing everything to buf directly, since buf
  // might not be correctly aligned.
  memcpy(buf, &header, kWavHeaderSize);
}